

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapl-configure.c
# Opt level: O1

void main_cold_13(void)

{
  fwrite("Cannot set a time window for peak power\n",0x28,1,_stderr);
  return;
}

Assistant:

static int check_constraint_supported(const rapl_configure_ctx* c) {
  assert(c != NULL);
  // Check the -l constraint
  int supported = raplcap_pd_is_constraint_supported(NULL, c->pkg, c->die, c->zone, c->constraint);
  if (supported < 0) {
    print_error_continue("Failed to determine if constraint is supported");
  } else if (supported == 0) {
    fprintf(stderr, "Constraint not supported\n");
    return -1;
  }
  // Check that time window is not specified for peak power constraint
  if (c->constraint == RAPLCAP_CONSTRAINT_PEAK_POWER && c->limit_constraint.seconds > 0) {
    fprintf(stderr, "Cannot set a time window for peak power\n");
    return -1;
  }
  // Check short term constraint if -W and/or -S are used
  // All zones (at least currently) support long term constraints, so no need to check c->set_long
  if (c->set_short) {
    supported = raplcap_pd_is_constraint_supported(NULL, c->pkg, c->die, c->zone, RAPLCAP_CONSTRAINT_SHORT_TERM);
    if (supported < 0) {
      print_error_continue("Failed to determine if short term constraint is supported");
    } else if (supported == 0) {
      fprintf(stderr, "Short term constraint not supported\n");
      return -1;
    }
  }
  return 0;
}